

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O2

void __thiscall PRED<TTA>::PerformLabeling(PRED<TTA> *this)

{
  long lVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  char cVar6;
  int iVar7;
  Mat1b *pMVar8;
  Mat1i *pMVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int r_i;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  uint *puVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar5 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar5;
  local_98.width = (int)((ulong)uVar5 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar5 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar5 >> 0x20) + 1) / 2) * (((int)uVar5 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar24 = *(int *)&pMVar8->field_0xc;
  iVar7 = *(int *)&pMVar8->field_0x8;
  lVar26 = *(long *)&pMVar8->field_0x10;
  lVar21 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar28 = 0xffffffffffffffff;
  while( true ) {
    lVar27 = (long)(int)uVar28;
    uVar28 = lVar27 + 1;
    if (iVar24 <= (int)uVar28) break;
    if (*(char *)(lVar26 + uVar28) != '\0') {
      uVar13 = TTA::NewLabel();
      *(uint *)(lVar21 + 4 + lVar27 * 4) = uVar13;
      uVar28 = lVar27 + 2;
      while( true ) {
        if ((long)iVar24 <= (long)uVar28) goto LAB_001952b0;
        if (*(char *)(lVar26 + uVar28) == '\0') break;
        *(undefined4 *)(lVar21 + uVar28 * 4) = *(undefined4 *)(lVar21 + -4 + uVar28 * 4);
        uVar28 = uVar28 + 1;
      }
      uVar28 = uVar28 & 0xffffffff;
    }
  }
LAB_001952b0:
  iVar24 = iVar24 + -1;
  lVar21 = (long)iVar24;
  lVar26 = 1;
  lVar27 = 0;
  do {
    if (iVar7 <= lVar26) {
      uVar13 = TTA::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
      pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar26 = 0; puVar3 = TTA::rtable_, lVar26 < *(int *)&pMVar9->field_0x8;
          lVar26 = lVar26 + 1) {
        lVar21 = **(long **)&pMVar9->field_0x48 * lVar26 + *(long *)&pMVar9->field_0x10;
        iVar24 = *(int *)&pMVar9->field_0xc;
        for (lVar27 = 0; (long)iVar24 * 4 != lVar27; lVar27 = lVar27 + 4) {
          *(uint *)(lVar21 + lVar27) = puVar3[*(uint *)(lVar21 + lVar27)];
        }
      }
      TTA::Dealloc();
      return;
    }
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar17 = *(long *)&pMVar8->field_0x10;
    lVar10 = **(long **)&pMVar8->field_0x48;
    lVar20 = lVar10 * lVar26;
    lVar2 = lVar17 + lVar20;
    pcVar22 = (char *)(lVar2 - lVar10);
    lVar11 = *(long *)&pMVar9->field_0x10;
    lVar12 = **(long **)&pMVar9->field_0x48;
    lVar15 = lVar12 * lVar26;
    puVar3 = (uint *)(lVar11 + lVar15);
    puVar23 = (uint *)((long)puVar3 - lVar12);
    if (iVar24 != 0) {
      if (*(char *)(lVar17 + lVar20) == '\0') {
        uVar28 = 0;
        goto LAB_001953da;
      }
      if (*pcVar22 == '\0') {
        if (pcVar22[1] == '\0') {
          uVar13 = TTA::NewLabel();
          *puVar3 = uVar13;
          lVar18 = 0;
          goto LAB_00195575;
        }
        *puVar3 = puVar23[1];
        iVar25 = 0;
        goto LAB_00195668;
      }
      *puVar3 = *puVar23;
      uVar28 = 0;
LAB_00195697:
      iVar25 = (int)uVar28;
      lVar18 = (long)iVar25;
      lVar14 = lVar18 << 0x20;
      lVar16 = lVar15 + lVar18 * 4;
      lVar29 = 0;
      do {
        if (lVar21 <= lVar18 + 1 + lVar29) {
          lVar17 = lVar14 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar17) != '\0') {
            if (pcVar22[lVar17] == '\0') {
LAB_0019580d:
              uVar13 = *(uint *)((long)puVar3 + (lVar14 >> 0x1e));
            }
            else {
              uVar13 = puVar23[lVar17];
            }
            puVar3[lVar17] = uVar13;
          }
          goto LAB_00195817;
        }
        if (*(char *)(lVar20 + lVar18 + lVar17 + 1 + lVar29) == '\0') {
          iVar25 = iVar25 + (int)lVar29;
          goto LAB_001957a0;
        }
        if (*(char *)(lVar10 * lVar27 + lVar18 + lVar17 + 1 + lVar29) == '\0') goto LAB_001957af;
        *(undefined4 *)(lVar11 + 4 + lVar16 + lVar29 * 4) =
             *(undefined4 *)(lVar12 * lVar27 + lVar18 * 4 + lVar11 + 4 + lVar29 * 4);
        lVar14 = lVar14 + 0x100000000;
        lVar29 = lVar29 + 1;
      } while( true );
    }
    if (*(char *)(lVar17 + lVar20) != '\0') {
      if (*pcVar22 == '\0') {
        uVar13 = TTA::NewLabel();
      }
      else {
        uVar13 = *puVar23;
      }
      *puVar3 = uVar13;
    }
LAB_00195817:
    lVar26 = lVar26 + 1;
    lVar27 = lVar27 + 1;
  } while( true );
LAB_001957af:
  lVar19 = lVar14 + 0x200000000 >> 0x20;
  if (pcVar22[lVar19] == '\0') {
    lVar18 = lVar18 + lVar29 + 1;
    *(undefined4 *)(lVar16 + lVar11 + 4 + lVar29 * 4) =
         *(undefined4 *)((long)puVar3 + (lVar14 >> 0x1e));
    goto LAB_00195575;
  }
  iVar25 = iVar25 + (int)lVar29;
  uVar13 = TTA::Merge(*(uint *)((long)puVar3 + (lVar14 >> 0x1e)),puVar23[lVar19]);
  *(uint *)(lVar16 + lVar11 + 4 + lVar29 * 4) = uVar13;
LAB_0019565e:
  uVar28 = (ulong)(iVar25 + 1);
  while( true ) {
    iVar25 = (int)uVar28;
LAB_00195668:
    lVar18 = (long)iVar25;
    uVar28 = lVar18 + 1;
    cVar6 = *(char *)(lVar2 + 1 + lVar18);
    if (iVar24 <= (int)uVar28) break;
    if (cVar6 != '\0') {
      puVar3[lVar18 + 1] = puVar23[lVar18 + 1];
      goto LAB_00195697;
    }
LAB_001953da:
    while( true ) {
      lVar14 = (long)(int)uVar28;
      lVar18 = lVar14 << 0x20;
      lVar16 = 0;
      do {
        lVar29 = lVar18;
        lVar19 = lVar29 >> 0x20;
        if (lVar21 <= lVar14 + lVar16 + 1) {
          lVar17 = lVar29 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar17) == '\0') goto LAB_00195817;
          if (pcVar22[lVar17] == '\0') {
            if (pcVar22[lVar19] == '\0') {
              uVar13 = TTA::NewLabel();
              puVar3[lVar17] = uVar13;
              goto LAB_00195817;
            }
            uVar13 = puVar23[lVar19];
          }
          else {
            uVar13 = puVar23[lVar17];
          }
          puVar3[lVar17] = uVar13;
          goto LAB_00195817;
        }
        lVar1 = lVar16 + 1;
        pcVar4 = (char *)(lVar20 + lVar14 + lVar17 + 1 + lVar16);
        lVar18 = lVar29 + 0x100000000;
        lVar16 = lVar1;
      } while (*pcVar4 == '\0');
      uVar28 = (uVar28 & 0xffffffff) + lVar1;
      if (*(char *)(lVar1 + lVar10 * lVar27 + lVar14 + lVar17) != '\0') {
        *(undefined4 *)(lVar15 + lVar14 * 4 + lVar11 + lVar1 * 4) =
             *(undefined4 *)(lVar12 * lVar27 + lVar14 * 4 + lVar11 + lVar1 * 4);
        goto LAB_00195697;
      }
      lVar18 = lVar29 + 0x200000000 >> 0x20;
      if (pcVar22[lVar18] != '\0') break;
      lVar18 = lVar14 + lVar1;
      if (pcVar22[lVar19] == '\0') {
        uVar13 = TTA::NewLabel();
      }
      else {
        uVar13 = puVar23[lVar19];
      }
      *(uint *)(lVar15 + lVar14 * 4 + lVar11 + lVar1 * 4) = uVar13;
LAB_00195575:
      iVar25 = (int)lVar18;
      lVar16 = (long)iVar25;
      lVar14 = lVar18 << 0x20;
      lVar18 = lVar15 + lVar16 * 4;
      lVar29 = lVar11 + lVar18;
      lVar19 = 0;
      while( true ) {
        if (lVar21 <= lVar16 + lVar19 + 1) {
          lVar17 = lVar14 + 0x100000000 >> 0x20;
          if (*(char *)(lVar2 + lVar17) == '\0') goto LAB_00195817;
          goto LAB_0019580d;
        }
        if (*(char *)(lVar20 + lVar16 + lVar17 + 1 + lVar19) == '\0') break;
        if (*(char *)(lVar10 * lVar27 + lVar16 + lVar17 + 2 + lVar19) != '\0') {
          iVar25 = iVar25 + (int)lVar19;
          uVar13 = TTA::Merge(*(uint *)((long)puVar3 + (lVar14 >> 0x1e)),
                              *(uint *)(lVar12 * lVar27 + lVar16 * 4 + lVar11 + 8 + lVar19 * 4));
          *(uint *)(lVar18 + lVar11 + 4 + lVar19 * 4) = uVar13;
          goto LAB_0019565e;
        }
        *(undefined4 *)(lVar29 + 4 + lVar19 * 4) = *(undefined4 *)(lVar29 + lVar19 * 4);
        lVar14 = lVar14 + 0x100000000;
        lVar19 = lVar19 + 1;
      }
      iVar25 = iVar25 + (int)lVar19;
LAB_001957a0:
      uVar28 = (ulong)(iVar25 + 1);
    }
    if (pcVar22[lVar19] == '\0') {
      uVar13 = puVar23[lVar18];
    }
    else {
      uVar13 = TTA::Merge(puVar23[lVar19],puVar23[lVar18]);
    }
    *(uint *)(lVar15 + lVar14 * 4 + lVar11 + lVar1 * 4) = uVar13;
  }
  if (cVar6 != '\0') {
    puVar3[lVar18 + 1] = puVar23[lVar18 + 1];
  }
  goto LAB_00195817;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }